

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_config.c
# Opt level: O0

void get_IP_config(char *hostname_buf,int len,int *IP_p,int *port_range_low_p,int *port_range_high_p
                  ,int *use_hostname_p,attr_list attrs,CMTransport_trace trace_func,void *trace_data
                  )

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  size_t sVar4;
  char *pcVar5;
  int *in_RCX;
  uint32_t *in_RDX;
  int in_ESI;
  char *in_RDI;
  int *in_R8;
  int *in_R9;
  undefined8 in_stack_00000008;
  code *in_stack_00000010;
  undefined8 in_stack_00000018;
  int net_byte_order;
  char buf [256];
  int tmp;
  char *lower;
  char *t;
  in_addr addr_1;
  char str_1 [16];
  char str [16];
  in_addr *in;
  char **p;
  hostent *host;
  in_addr addr;
  char *port_range;
  char *preferred_IP;
  char *preferred_hostname;
  char *iface;
  int IP_to_use;
  char hostname_to_use [256];
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  CMTransport_trace in_stack_fffffffffffffd10;
  uint32_t local_2cc;
  char local_2c8 [260];
  int local_1c4;
  char *local_1c0;
  char *local_1b8;
  uint32_t local_1ac;
  char local_1a8 [16];
  char local_198 [24];
  uint32_t *local_180;
  char **local_178;
  hostent *local_170;
  in_addr local_164;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined8 local_148;
  uint32_t local_13c;
  char local_138 [224];
  char *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  CMTransport_trace in_stack_ffffffffffffffb8;
  
  local_148 = 0;
  if (get_IP_config::first_call != 0) {
    local_150 = getenv("ADIOS2_HOSTNAME");
    local_158 = getenv("ADIOS2_IP");
    local_160 = getenv("ADIOS2_PORT_RANGE");
    CM_IP_INTERFACE = attr_atom_from_string("IP_INTERFACE");
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    atom_init = atom_init + 1;
    get_IP_config::first_call = 0;
    get_IP_config::determined_hostname[0] = '\0';
    if (local_158 == (char *)0x0) {
      if (local_150 == (char *)0x0) {
        get_qual_hostname((char *)hostname_to_use._144_8_,hostname_to_use._140_4_,
                          (attr_list)hostname_to_use._128_8_,(int *)hostname_to_use._120_8_,
                          (CMTransport_trace)hostname_to_use._112_8_,(void *)hostname_to_use._104_8_
                         );
        dump_output(0x3ff,"\tADIOS2_IP_CONFIG best guess hostname is \"%s\"\n",
                    get_IP_config::determined_hostname);
      }
      else {
        get_IP_config::use_hostname = 1;
        (*in_stack_00000010)
                  (in_stack_00000018,"CM<IP_CONFIG> CM_HOSTNAME set to \"%s\", running with that.",
                   local_150);
        dump_output(0x3ff,"\tADIOS2_HOSTNAME environment variable found, trying \"%s\"\n",local_150)
        ;
        local_170 = gethostbyname(local_150);
        strcpy(get_IP_config::determined_hostname,local_150);
        if (local_170 == (hostent *)0x0) {
          printf("Warning, ADIOS2_HOSTNAME is \"%s\", but gethostbyname fails for that string.\n",
                 local_150);
          dump_output(0x3ff,"\tADIOS2_HOSTNAME \"%s\" fails to translate to IP address.\n",local_150
                     );
        }
        else {
          for (local_178 = local_170->h_addr_list; *local_178 != (char *)0x0;
              local_178 = local_178 + 1) {
            local_180 = (uint32_t *)*local_178;
            ntohl(*local_180);
            iVar1 = ipv4_is_loopback((int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
            if (iVar1 == 0) {
              inet_ntop(2,local_180,local_198,0x10);
              (*in_stack_00000010)
                        (in_stack_00000018,
                         "CM IP_CONFIG Prefer IP associated with hostname net -> %s",local_198);
              dump_output(0x3ff,"\tHOSTNAME \"%s\" translates to IP address %s.\n",local_150,
                          local_198);
              get_IP_config::determined_IP = ntohl(*local_180);
            }
          }
          if (get_IP_config::determined_IP == -1) {
            dump_output(0x3ff,
                        "\tNo non-loopback interfaces found for hostname \"%s\", rejected for IP use.\n"
                        ,local_150);
          }
        }
      }
    }
    else {
      if (local_150 != (char *)0x0) {
        printf("Warning, ADIOS2_HOSTNAME and ADIOS2_IP are both set, preferring ADIOS2_IP\n");
      }
      iVar1 = inet_aton(local_158,&local_164);
      if (iVar1 == 0) {
        fprintf(_stderr,"Invalid address %s specified for ADIOS2_IP\n",local_158);
      }
      else {
        (*in_stack_00000010)
                  (in_stack_00000018,"CM IP_CONFIG Using IP specified in ADIOS2_IP, %s",local_158);
        get_IP_config::determined_IP = ntohl(local_164.s_addr);
        dump_output(0x3ff,"\tADIOS2_IP environment variable found, preferring IP %s\n",local_158);
      }
    }
    if (get_IP_config::determined_IP == -1) {
      get_IP_config::determined_IP =
           get_self_ip_addr(in_stack_fffffffffffffd10,
                            (void *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      local_1ac = ntohl(get_IP_config::determined_IP);
      inet_ntop(2,&local_1ac,local_1a8,0x10);
      dump_output(0x3ff,"\tADIOS2_IP_CONFIG best guess IP is \"%s\"\n",local_1a8);
    }
    if (local_160 == (char *)0x0) {
      local_160 = "ANY";
    }
    if (local_160 != (char *)0x0) {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)*local_160] & 0x400) == 0) {
        iVar2 = __isoc99_sscanf(local_160,"%d:%d",&get_IP_config::port_range_high,
                                &get_IP_config::port_range_low);
        iVar1 = get_IP_config::port_range_high;
        if (iVar2 == 2) {
          if (get_IP_config::port_range_high < get_IP_config::port_range_low) {
            local_1c4 = get_IP_config::port_range_high;
            get_IP_config::port_range_high = get_IP_config::port_range_low;
            get_IP_config::port_range_low = iVar1;
          }
        }
        else {
          printf("ADIOS2_PORT_RANGE spec not understood \"%s\"\n",local_160);
        }
      }
      else {
        local_1c0 = strdup(local_160);
        local_1b8 = local_1c0;
        for (; *local_1c0 != '\0'; local_1c0 = local_1c0 + 1) {
          iVar1 = tolower((int)*local_1c0);
          *local_1c0 = (char)iVar1;
        }
        iVar1 = strcmp(local_1b8,"any");
        if (iVar1 == 0) {
          get_IP_config::port_range_high = -1;
          get_IP_config::port_range_low = -1;
        }
        else {
          printf("ADIOS2_PORT_RANGE spec not understood \"%s\"\n",local_160);
        }
        free(local_1b8);
      }
    }
    if (get_IP_config::port_range_low == -1) {
      dump_output(0x3ff,"\tADIOS2_IP_CONFIG specified port range is \"ANY\" (unspecified)\n");
    }
    else {
      dump_output(0x3ff,"\tADIOS2_IP_CONFIG specified port range is %d:%d\n",
                  (ulong)(uint)get_IP_config::port_range_low,
                  (ulong)(uint)get_IP_config::port_range_high);
    }
  }
  iVar1 = get_string_attr(in_stack_00000008,CM_IP_INTERFACE,&local_148);
  if (iVar1 == 0) {
    strcpy(local_138,get_IP_config::determined_hostname);
    local_13c = get_IP_config::determined_IP;
  }
  else {
    get_qual_hostname((char *)hostname_to_use._144_8_,hostname_to_use._140_4_,
                      (attr_list)hostname_to_use._128_8_,(int *)hostname_to_use._120_8_,
                      (CMTransport_trace)hostname_to_use._112_8_,(void *)hostname_to_use._104_8_);
    local_13c = get_self_ip_iface(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                  in_stack_ffffffffffffffa8);
  }
  if ((in_RDI != (char *)0x0) &&
     (sVar4 = strlen(get_IP_config::determined_hostname), sVar4 < (ulong)(long)in_ESI)) {
    strcpy(in_RDI,local_138);
  }
  if ((in_RDX != (uint32_t *)0x0) && (get_IP_config::determined_IP != -1)) {
    *in_RDX = local_13c;
  }
  if (in_RCX != (int *)0x0) {
    *in_RCX = get_IP_config::port_range_low;
  }
  if (in_R8 != (int *)0x0) {
    *in_R8 = get_IP_config::port_range_high;
  }
  if (in_R9 != (int *)0x0) {
    *in_R9 = get_IP_config::use_hostname;
  }
  local_2cc = htonl(local_13c);
  pcVar5 = inet_ntop(2,&local_2cc,local_2c8,0x100);
  (*in_stack_00000010)
            (in_stack_00000018,
             "CM<IP_CONFIG> returning hostname \"%s\", IP %s, use_hostname = %d, port range %d:%d",
             local_138,pcVar5,get_IP_config::use_hostname,get_IP_config::port_range_low,
             get_IP_config::port_range_high);
  return;
}

Assistant:

extern void
get_IP_config(char *hostname_buf, int len, int* IP_p, int *port_range_low_p, int *port_range_high_p, 
	      int *use_hostname_p, attr_list attrs, CMTransport_trace trace_func, void *trace_data)
{
    static int first_call = 1;
    static char determined_hostname[HOST_NAME_MAX+1];
    static int determined_IP = -1;
    static int port_range_low = 0, port_range_high = 0;
    static int use_hostname = 0;
    char hostname_to_use[HOST_NAME_MAX+1];
    int IP_to_use;
    char *iface = NULL;

    if (first_call) {
	char *preferred_hostname = getenv(IPCONFIG_ENVVAR_PREFIX "HOSTNAME");
	char *preferred_IP = getenv(IPCONFIG_ENVVAR_PREFIX "IP");
	char *port_range = getenv(IPCONFIG_ENVVAR_PREFIX "PORT_RANGE");
	CM_IP_INTERFACE = attr_atom_from_string("IP_INTERFACE");
	CM_IP_PORT = attr_atom_from_string("IP_PORT");
	(void) CM_IP_PORT;
	atom_init++;
	first_call = 0;
	determined_hostname[0] = 0;
	
	if (preferred_IP != NULL) {
	    struct in_addr addr;
	    if (preferred_hostname) printf("Warning, " IPCONFIG_ENVVAR_PREFIX "HOSTNAME and " IPCONFIG_ENVVAR_PREFIX "IP are both set, preferring " IPCONFIG_ENVVAR_PREFIX "IP\n");
	    if (inet_aton(preferred_IP, &addr) == 0) {
		fprintf(stderr, "Invalid address %s specified for " IPCONFIG_ENVVAR_PREFIX "IP\n", preferred_IP);
	    } else {
		trace_func(trace_data, "CM IP_CONFIG Using IP specified in " IPCONFIG_ENVVAR_PREFIX "IP, %s", preferred_IP);
		determined_IP =  (ntohl(addr.s_addr));
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP environment variable found, preferring IP %s\n", preferred_IP);
	    }
	} else if (preferred_hostname != NULL) {
	    struct hostent *host;
	    use_hostname = 1;
	    trace_func(trace_data, "CM<IP_CONFIG> CM_HOSTNAME set to \"%s\", running with that.", preferred_hostname);
	    dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "HOSTNAME environment variable found, trying \"%s\"\n", preferred_hostname);
	    host = gethostbyname(preferred_hostname);
	    strcpy(determined_hostname, preferred_hostname);
	    if (!host) {
		printf("Warning, " IPCONFIG_ENVVAR_PREFIX "HOSTNAME is \"%s\", but gethostbyname fails for that string.\n", preferred_hostname);
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "HOSTNAME \"%s\" fails to translate to IP address.\n", preferred_hostname);
	    } else {
		char **p;
		for (p = host->h_addr_list; *p != 0; p++) {
		    struct in_addr *in = *(struct in_addr **) p;
		    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		        char str[INET_ADDRSTRLEN];
					      
			inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
			trace_func(trace_data, "CM IP_CONFIG Prefer IP associated with hostname net -> %s", str);
			dump_output(1023, "\t" "HOSTNAME \"%s\" translates to IP address %s.\n", preferred_hostname, str);
			determined_IP  = (ntohl(in->s_addr));
		    }
		}
		if (determined_IP == -1) {
		    dump_output(1023, "\t" "No non-loopback interfaces found for hostname \"%s\", rejected for IP use.\n", preferred_hostname);
		}
	    }
	} else {
	    get_qual_hostname(determined_hostname, sizeof(determined_hostname) - 1, NULL /* attrs */, NULL, trace_func, trace_data);
	    dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG best guess hostname is \"%s\"\n", determined_hostname);
	}
	if (determined_IP == -1) {
	    /* I.E. the specified hostname didn't determine what IP we should use */
	    char str[INET_ADDRSTRLEN];
	    struct in_addr addr;
	    determined_IP = get_self_ip_addr(trace_func, trace_data);
					      
	    addr.s_addr = ntohl(determined_IP);
	    inet_ntop(AF_INET, &(addr.s_addr), str, sizeof(str));
	    dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG best guess IP is \"%s\"\n", str);
	}
	if (port_range == NULL) {
	    // no getenv
	    port_range = EVPATH_DEFAULT_PORT_RANGE;
	}
	if (port_range != NULL) {
	    if (isalpha(port_range[0])) {
		char *t = strdup(port_range);
		char *lower = t;
		for ( ; *lower; ++lower) *lower = tolower(*lower);
		if (strcmp(t, "any") == 0) {
		    port_range_high = -1;
		    port_range_low = -1;
		} else {
		    printf(IPCONFIG_ENVVAR_PREFIX "PORT_RANGE spec not understood \"%s\"\n", port_range);
		}
		free(t);
	    } else {
		if (sscanf(port_range, "%d:%d", &port_range_high, &port_range_low) != 2) {
		    printf(IPCONFIG_ENVVAR_PREFIX "PORT_RANGE spec not understood \"%s\"\n", port_range);
		} else {
		    if (port_range_high < port_range_low) {
			int tmp = port_range_high;
			port_range_high = port_range_low;
			port_range_low = tmp;
		    }
		}
	    }
	}
	if (port_range_low == -1) {
	    dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG specified port range is \"ANY\" (unspecified)\n");
	} else {
	    dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG specified port range is %d:%d\n", port_range_low, port_range_high);
	}	    
    }


    if (get_string_attr(attrs, CM_IP_INTERFACE, &iface)) {
	/* don't use predetermined stuff ! */
	get_qual_hostname(hostname_to_use, sizeof(hostname_to_use) - 1 , attrs, NULL, trace_func, trace_data);
	IP_to_use = get_self_ip_iface(trace_func, trace_data, iface);
    } else {
	strcpy(hostname_to_use, determined_hostname);
	IP_to_use = determined_IP;
    }
    if (hostname_buf && (len > strlen(determined_hostname))) {
	strcpy(hostname_buf, hostname_to_use);
    }
    if (IP_p && (determined_IP != -1)) {
	*IP_p = IP_to_use;
    }
    
    if (port_range_low_p) {
	*port_range_low_p = port_range_low;
    }
    if (port_range_high_p) {
	*port_range_high_p = port_range_high;
    }
    if (use_hostname_p) {
	*use_hostname_p = use_hostname;
    }
    {
	char buf[256];
	int net_byte_order = htonl(IP_to_use);
	trace_func(trace_data, "CM<IP_CONFIG> returning hostname \"%s\", IP %s, use_hostname = %d, port range %d:%d",
		   hostname_to_use, inet_ntop(AF_INET, &net_byte_order, &buf[0], 256), use_hostname, port_range_low, port_range_high);
    }
}